

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walk-ports.cpp
# Opt level: O3

int main(void)

{
  check_all_subports(&ports,"/a/b/c/d/e;/a/b/c/d/e;","walk_ports with \"/a/b/c\"",0x48);
  check_all_subports(&numeric_ports,
                     "/a0/b0/c/e;/a0/b1/c/e;/a1/b0/c/e;/a1/b1/c/e;/a2/b0/c/e;/a2/b1/c/e;",
                     "walk_ports with \"a#3/b#2/c\"",0x4e);
  check_all_subports(&numeric_ports_integer,
                     "/a0/b0/c/e;/a0/b1/c/e;/a1/b0/c/e;/a1/b1/c/e;/a2/b0/c/e;/a2/b1/c/e;",
                     "walk_ports with \"a#3/b#2/c/::i\"",0x51);
  check_all_subports(&multiple_ports,"/c/d/e;/a/x;/a/y;/c/d/;/a/;/b;/b2;",
                     "walk_ports with multiple common prefixes",0x5c);
  printf("# %d test(s) failed out of %d (currently passing %f%% tests)\n",
         100.0 - ((double)global_err * 100.0) / (double)test_counter);
  return (uint)(global_err != 0);
}

Assistant:

int main()
{
    check_all_subports(ports, "/a/b/c/d/e;/a/b/c/d/e;",
                       "walk_ports with \"/a/b/c\"", __LINE__);

    const char* numeric_exp = "/a0/b0/c/e;/a0/b1/c/e;"
                              "/a1/b0/c/e;/a1/b1/c/e;"
                              "/a2/b0/c/e;/a2/b1/c/e;";
    check_all_subports(numeric_ports, numeric_exp,
                       "walk_ports with \"a#3/b#2/c\"", __LINE__);

    check_all_subports(numeric_ports_integer, numeric_exp,
                       "walk_ports with \"a#3/b#2/c/::i\"", __LINE__);

#if 0
    check_all_subports(numeric_port, numeric_exp,
                       "walk_ports with \"a#3/b#2/c::i\"", __LINE__);
    // still failing: bundle-foreach.h needs a recursion like walk_ports
    // has it for subports with multiple hashes
#endif

    // maybe this should once be sorted...
    check_all_subports(multiple_ports, "/c/d/e;/a/x;/a/y;/c/d/;/a/;/b;/b2;",
                       "walk_ports with multiple common prefixes", __LINE__);

    return test_summary();
}